

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O3

void __thiscall JetHead::vector<TestCase_*>::sizeup(vector<TestCase_*> *this,uint newSize)

{
  uint uVar1;
  TestCase **ppTVar2;
  TestCase **ppTVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0x20;
  if (this->mAllocated != 0) {
    uVar5 = (ulong)(this->mAllocated * 2);
  }
  if (newSize != 0) {
    uVar5 = (ulong)newSize;
  }
  ppTVar3 = (TestCase **)operator_new__(uVar5 * 8);
  ppTVar2 = this->mData;
  if (ppTVar2 != (TestCase **)0x0) {
    uVar1 = this->mSize;
    if ((ulong)uVar1 != 0) {
      uVar4 = 0;
      do {
        ppTVar3[uVar4] = ppTVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    operator_delete__(ppTVar2);
  }
  this->mData = ppTVar3;
  this->mAllocated = (uint)uVar5;
  return;
}

Assistant:

void sizeup(unsigned newSize=0)
		{
			// No size was specified, double the existing size.
			// Doubling a self-expanding array means that storing O(n) 
			// elements takes O(n lg n) worst case.  Adding only a 
			// constant number of elements makes that O(n^2).
			if (newSize == 0) 
			{
				// If we allocated ANYTHING yet, then double it, if 
				// not just use the default size.
				if (mAllocated)
				{
					newSize = mAllocated * 2;
				} else {
					newSize = DEFAULT_ALLOCATION;
				}
			}

			// A new buffer
			T* temp = (T*)(new uint8_t[sizeof(T) * newSize]);

			// If we had data, copy it over
			if (mData)
			{
				// Move all of my data into the new buffer (copy then delete)
				for (unsigned i = 0; i < mSize; i++)
				{
					new(temp + i) T(mData[i]);
					mData[i].~T();
				}
				
				// Delete old buffer
				delete[] (uint8_t*)mData;
			}
			
			// Keep new buffer
			mData = temp;

			// Remember new allocation size
			mAllocated = newSize;
		}